

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_ReadWriteLock.cpp
# Opt level: O3

int __thiscall axl::sys::ReadWriteLock::close(ReadWriteLock *this,int __fd)

{
  Data *pDVar1;
  int iVar2;
  
  pDVar1 = this->m_data;
  if ((pDVar1 != (Data *)0x0) && (pDVar1 != (Data *)(this->m_mapping).m_p)) {
    operator_delete(pDVar1);
  }
  this->m_data = (Data *)0x0;
  NameableEventBase<axl::sl::True>::close(&this->m_readEvent,__fd);
  NameableEventBase<axl::sl::False>::close(&this->m_writeEvent,__fd);
  iVar2 = io::Mapping::close(&this->m_mapping,__fd);
  return iVar2;
}

Assistant:

void
ReadWriteLock::close() {
	if (m_data && m_data != m_mapping.p())
		delete m_data;

	m_data = NULL;

	m_readEvent.close();
	m_writeEvent.close();
	m_mapping.close();
}